

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover.cxx
# Opt level: O2

void __thiscall FlickerRemover::clear(FlickerRemover *this)

{
  UMat *pUVar1;
  
  while( true ) {
    pUVar1 = CircularBuffer<cv::UMat_*>::pop(&this->corresponding_frames_similarity_levels);
    if (pUVar1 == (UMat *)0x0) break;
    cv::UMat::~UMat(pUVar1);
    operator_delete(pUVar1,0x50);
  }
  while( true ) {
    pUVar1 = CircularBuffer<cv::UMat_*>::pop(&this->adjacent_frames_similarity_levels);
    if (pUVar1 == (UMat *)0x0) break;
    cv::UMat::~UMat(pUVar1);
    operator_delete(pUVar1,0x50);
  }
  return;
}

Assistant:

void FlickerRemover::clear() {
    auto to_delete_1 = corresponding_frames_similarity_levels.pop();
    while(to_delete_1 != nullptr) {
        delete to_delete_1;
        to_delete_1 = corresponding_frames_similarity_levels.pop();
    }
    auto to_delete_2 = adjacent_frames_similarity_levels.pop();
    while(to_delete_2 != nullptr) {
        delete to_delete_2;
        to_delete_2 = adjacent_frames_similarity_levels.pop();
    }
}